

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall
CConnman::AddWhitelistPermissionFlags
          (CConnman *this,NetPermissionFlags *flags,CNetAddr *addr,
          vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_> *ranges)

{
  long lVar1;
  bool bVar2;
  CNetAddr *in_RCX;
  CSubNet *in_RDX;
  vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_> *in_RDI;
  long in_FS_OFFSET;
  NetWhitelistPermissions *subnet;
  vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  NetPermissionFlags in_stack_ffffffffffffffa8;
  NetPermissionFlags in_stack_ffffffffffffffac;
  reference in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>::begin(in_RDI);
  std::vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>::end(in_RDI);
  while (bVar2 = __gnu_cxx::
                 operator==<const_NetWhitelistPermissions_*,_std::vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>_>
                           ((__normal_iterator<const_NetWhitelistPermissions_*,_std::vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>_>
                             *)in_stack_ffffffffffffffb8,
                            (__normal_iterator<const_NetWhitelistPermissions_*,_std::vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>_>
                             *)in_RDI), ((bVar2 ^ 0xffU) & 1) != 0) {
    in_stack_ffffffffffffffb8 =
         __gnu_cxx::
         __normal_iterator<const_NetWhitelistPermissions_*,_std::vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>_>
         ::operator*((__normal_iterator<const_NetWhitelistPermissions_*,_std::vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>_>
                      *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    bVar2 = CSubNet::Match(in_RDX,in_RCX);
    if (bVar2) {
      NetPermissions::AddFlag
                ((NetPermissionFlags *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
                 ,None);
    }
    __gnu_cxx::
    __normal_iterator<const_NetWhitelistPermissions_*,_std::vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>_>
    ::operator++((__normal_iterator<const_NetWhitelistPermissions_*,_std::vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>_>
                  *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  bVar2 = NetPermissions::HasFlag(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
  if (bVar2) {
    NetPermissions::ClearFlag
              ((NetPermissionFlags *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               None);
    if (((ulong)in_RDI[0x28].
                super__Vector_base<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>
                ._M_impl.super__Vector_impl_data._M_start & 1) != 0) {
      NetPermissions::AddFlag
                ((NetPermissionFlags *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
                 ,None);
    }
    if (((ulong)in_RDI[0x28].
                super__Vector_base<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>
                ._M_impl.super__Vector_impl_data._M_start & 0x100) != 0) {
      NetPermissions::AddFlag
                ((NetPermissionFlags *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
                 ,None);
    }
    NetPermissions::AddFlag
              ((NetPermissionFlags *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               None);
    NetPermissions::AddFlag
              ((NetPermissionFlags *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               None);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CConnman::AddWhitelistPermissionFlags(NetPermissionFlags& flags, const CNetAddr &addr, const std::vector<NetWhitelistPermissions>& ranges) const {
    for (const auto& subnet : ranges) {
        if (subnet.m_subnet.Match(addr)) {
            NetPermissions::AddFlag(flags, subnet.m_flags);
        }
    }
    if (NetPermissions::HasFlag(flags, NetPermissionFlags::Implicit)) {
        NetPermissions::ClearFlag(flags, NetPermissionFlags::Implicit);
        if (whitelist_forcerelay) NetPermissions::AddFlag(flags, NetPermissionFlags::ForceRelay);
        if (whitelist_relay) NetPermissions::AddFlag(flags, NetPermissionFlags::Relay);
        NetPermissions::AddFlag(flags, NetPermissionFlags::Mempool);
        NetPermissions::AddFlag(flags, NetPermissionFlags::NoBan);
    }
}